

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12e9c1::DebGenerator::DebGenerator
          (DebGenerator *this,cmCPackLog *logger,string *outputName,string *workDir,
          string *topLevelDir,string *temporaryDir,cmValue debCompressionType,cmValue numThreads,
          cmValue debianArchiveType,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *controlValues,bool genShLibs,string *shLibsFilename,bool genPostInst,string *postInst,
          bool genPostRm,string *postRm,cmValue controlExtra,bool permissionStrictPolicy,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageFiles)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  string local_3f8 [32];
  string *local_3d8;
  undefined1 local_3d0 [8];
  ostringstream cmCPackLog_msg_1;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string debianCompressionType;
  bool permissionStrictPolicy_local;
  bool genPostRm_local;
  bool genPostInst_local;
  bool genShLibs_local;
  string *temporaryDir_local;
  string *topLevelDir_local;
  string *workDir_local;
  string *outputName_local;
  cmCPackLog *logger_local;
  DebGenerator *this_local;
  cmValue controlExtra_local;
  cmValue debianArchiveType_local;
  cmValue numThreads_local;
  cmValue debCompressionType_local;
  
  numThreads_local = debCompressionType;
  debianArchiveType_local = numThreads;
  controlExtra_local = debianArchiveType;
  this->Logger = logger;
  std::__cxx11::string::string((string *)&this->OutputName,(string *)outputName);
  std::__cxx11::string::string((string *)&this->WorkDir,(string *)workDir);
  std::__cxx11::string::string((string *)&this->CompressionSuffix);
  std::__cxx11::string::string((string *)&this->TopLevelDir,(string *)topLevelDir);
  std::__cxx11::string::string((string *)&this->TemporaryDir,(string *)temporaryDir);
  bVar2 = cmValue::operator_cast_to_bool(&controlExtra_local);
  debianCompressionType.field_2._M_local_buf[10] = '\0';
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&controlExtra_local);
    std::__cxx11::string::string((string *)&this->DebianArchiveType,(string *)psVar5);
  }
  else {
    std::allocator<char>::allocator();
    debianCompressionType.field_2._M_local_buf[10] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&this->DebianArchiveType,"gnutar",
               (allocator<char> *)(debianCompressionType.field_2._M_local_buf + 0xb));
  }
  if ((debianCompressionType.field_2._M_local_buf[10] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(debianCompressionType.field_2._M_local_buf + 0xb));
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ControlValues,controlValues);
  this->GenShLibs = genShLibs;
  std::__cxx11::string::string((string *)&this->ShLibsFilename,(string *)shLibsFilename);
  this->GenPostInst = genPostInst;
  std::__cxx11::string::string((string *)&this->PostInst,(string *)postInst);
  this->GenPostRm = genPostRm;
  std::__cxx11::string::string((string *)&this->PostRm,(string *)postRm);
  (this->ControlExtra).Value = controlExtra.Value;
  this->PermissionStrictPolicy = permissionStrictPolicy;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->PackageFiles,packageFiles);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"gzip",&local_b9);
  std::allocator<char>::~allocator(&local_b9);
  bVar2 = cmValue::operator_cast_to_bool(&numThreads_local);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&numThreads_local);
    std::__cxx11::string::operator=((string *)local_b8,(string *)psVar5);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,"lzma");
  if (bVar2) {
    std::__cxx11::string::operator=((string *)&this->CompressionSuffix,".lzma");
    this->TarCompressionType = CompressLZMA;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"xz");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->CompressionSuffix,".xz");
      this->TarCompressionType = CompressXZ;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"bzip2");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->CompressionSuffix,".bz2");
        this->TarCompressionType = CompressBZip2;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"gzip");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&this->CompressionSuffix,".gz");
          this->TarCompressionType = CompressGZip;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"zstd");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&this->CompressionSuffix,".zst");
            this->TarCompressionType = CompressZstd;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"none");
            if (bVar2) {
              std::__cxx11::string::clear();
              this->TarCompressionType = CompressNone;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
              poVar3 = std::operator<<((ostream *)local_238,"Error unrecognized compression type: ")
              ;
              poVar3 = std::operator<<(poVar3,(string *)local_b8);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar4 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                              ,0x7d,pcVar4);
              std::__cxx11::string::~string(local_258);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
            }
          }
        }
      }
    }
  }
  bVar2 = cmValue::operator_cast_to_bool(&debianArchiveType_local);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&debianArchiveType_local);
    bVar2 = cmStrToLong(psVar5,&this->NumThreads);
    if (!bVar2) {
      this->NumThreads = 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
      poVar3 = std::operator<<((ostream *)local_3d0,"Unrecognized number of threads: ");
      local_3d8 = debianArchiveType_local.Value;
      poVar3 = ::operator<<(poVar3,debianArchiveType_local);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x85,pcVar4);
      std::__cxx11::string::~string(local_3f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    }
  }
  else {
    this->NumThreads = 1;
  }
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

DebGenerator::DebGenerator(
  cmCPackLog* logger, std::string outputName, std::string workDir,
  std::string topLevelDir, std::string temporaryDir,
  cmValue debCompressionType, cmValue numThreads, cmValue debianArchiveType,
  std::map<std::string, std::string> controlValues, bool genShLibs,
  std::string shLibsFilename, bool genPostInst, std::string postInst,
  bool genPostRm, std::string postRm, cmValue controlExtra,
  bool permissionStrictPolicy, std::vector<std::string> packageFiles)
  : Logger(logger)
  , OutputName(std::move(outputName))
  , WorkDir(std::move(workDir))
  , TopLevelDir(std::move(topLevelDir))
  , TemporaryDir(std::move(temporaryDir))
  , DebianArchiveType(debianArchiveType ? *debianArchiveType : "gnutar")
  , ControlValues(std::move(controlValues))
  , GenShLibs(genShLibs)
  , ShLibsFilename(std::move(shLibsFilename))
  , GenPostInst(genPostInst)
  , PostInst(std::move(postInst))
  , GenPostRm(genPostRm)
  , PostRm(std::move(postRm))
  , ControlExtra(controlExtra)
  , PermissionStrictPolicy(permissionStrictPolicy)
  , PackageFiles(std::move(packageFiles))
{
  std::string debianCompressionType = "gzip";
  if (debCompressionType) {
    debianCompressionType = *debCompressionType;
  }

  if (debianCompressionType == "lzma") {
    this->CompressionSuffix = ".lzma";
    this->TarCompressionType = cmArchiveWrite::CompressLZMA;
  } else if (debianCompressionType == "xz") {
    this->CompressionSuffix = ".xz";
    this->TarCompressionType = cmArchiveWrite::CompressXZ;
  } else if (debianCompressionType == "bzip2") {
    this->CompressionSuffix = ".bz2";
    this->TarCompressionType = cmArchiveWrite::CompressBZip2;
  } else if (debianCompressionType == "gzip") {
    this->CompressionSuffix = ".gz";
    this->TarCompressionType = cmArchiveWrite::CompressGZip;
  } else if (debianCompressionType == "zstd") {
    this->CompressionSuffix = ".zst";
    this->TarCompressionType = cmArchiveWrite::CompressZstd;
  } else if (debianCompressionType == "none") {
    this->CompressionSuffix.clear();
    this->TarCompressionType = cmArchiveWrite::CompressNone;
  } else {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error unrecognized compression type: "
                    << debianCompressionType << std::endl);
  }

  if (numThreads) {
    if (!cmStrToLong(*numThreads, &this->NumThreads)) {
      this->NumThreads = 1;
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Unrecognized number of threads: " << numThreads
                                                       << std::endl);
    }
  } else {
    this->NumThreads = 1;
  }
}